

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoBinop<int,int>(Thread *this,BinopTrapFunc<int,_int> *f,Ptr *out_trap)

{
  int iVar1;
  int iVar2;
  RunResult RVar3;
  Ptr local_70;
  undefined1 local_58 [8];
  string msg;
  int out;
  int lhs;
  int rhs;
  Ptr *out_trap_local;
  BinopTrapFunc<int,_int> *f_local;
  Thread *this_local;
  
  iVar1 = Pop<int>(this);
  iVar2 = Pop<int>(this);
  std::__cxx11::string::string((string *)local_58);
  RVar3 = (*f)(iVar2,iVar1,(int *)(msg.field_2._M_local_buf + 0xc),(string *)local_58);
  if (RVar3 == Trap) {
    Trap::New(&local_70,this->store_,(string *)local_58,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=(out_trap,&local_70);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_70);
  }
  else {
    Push<int>(this,msg.field_2._12_4_);
    this_local._4_4_ = Ok;
  }
  std::__cxx11::string::~string((string *)local_58);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoBinop(BinopTrapFunc<R, T> f, Trap::Ptr* out_trap) {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  T out;
  std::string msg;
  TRAP_IF(f(lhs, rhs, &out, &msg) == RunResult::Trap, msg);
  Push<R>(out);
  return RunResult::Ok;
}